

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_100(QPDF *pdf,char *arg2)

{
  byte bVar1;
  bool bVar2;
  logic_error *plVar3;
  size_t sVar4;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvVar5;
  const_reference pvVar6;
  initializer_list<QPDFObjectHandle> *local_558;
  undefined1 local_448 [8];
  QPDFObjectHandle o;
  const_iterator __end1;
  const_iterator __begin1;
  QPDFObjectHandle QStack_418;
  QPDFObjectHandle QStack_408;
  initializer_list<QPDFObjectHandle> local_3f8;
  initializer_list<QPDFObjectHandle> *local_3e8;
  initializer_list<QPDFObjectHandle> *__range1;
  string local_3d8 [32];
  undefined1 local_3b8 [8];
  QPDFObjectHandle copied_page;
  string local_3a0 [32];
  undefined1 local_380 [8];
  QPDFObjectHandle copied_root;
  string local_368 [32];
  undefined1 local_348 [8];
  QPDFObjectHandle page_metadata;
  value_type page;
  string local_320 [39];
  allocator<char> local_2f9;
  string local_2f8 [32];
  QPDFObjectHandle local_2d8;
  QPDFObjectHandle local_2c8;
  longlong local_2b8;
  size_t local_2b0;
  size_t n_pages;
  string local_2a0 [32];
  undefined1 local_280 [8];
  QPDFObjectHandle root_metadata;
  QPDFObjectHandle root;
  QPDF updated;
  string raw_bytes;
  QPDFWriter w_1;
  allocator<char> local_221;
  string local_220 [32];
  QPDFObjectHandle local_200;
  allocator<char> local_1e9;
  string local_1e8 [32];
  QPDFObjectHandle local_1c8;
  QPDFObjectHandle local_1b8;
  undefined1 local_1a8 [8];
  QPDFObjectHandle copied_page_metadata;
  undefined1 local_188 [8];
  QPDFObjectHandle copied_root_metadata;
  string local_170 [32];
  undefined1 local_150 [8];
  QPDFObjectHandle page_metadata_1;
  value_type page_1;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [32];
  QPDFObjectHandle local_e0;
  QPDFObjectHandle local_d0;
  longlong local_c0;
  size_t local_b8;
  size_t n_pages_1;
  string local_a8 [32];
  undefined1 local_88 [8];
  QPDFObjectHandle root_metadata_1;
  QPDFObjectHandle root_1;
  string raw_bytes_1;
  QPDF encrypted;
  QPDFWriter local_30 [8];
  QPDFWriter w;
  anon_class_1_0_00000001 local_1a;
  anon_class_1_0_00000001 local_19;
  anon_class_1_0_00000001 is_cleartext_in_file;
  char *pcStack_18;
  anon_class_1_0_00000001 is_cleartext;
  char *arg2_local;
  QPDF *pdf_local;
  
  pcStack_18 = arg2;
  QPDFWriter::QPDFWriter(local_30,pdf,"a.pdf");
  QPDFWriter::setR6EncryptionParameters
            ((char *)local_30,"",true,true,true,true,true,true,qpdf_r3p_low,false);
  QPDFWriter::write();
  QPDFWriter::~QPDFWriter(local_30);
  QPDF::QPDF((QPDF *)(raw_bytes_1.field_2._M_local_buf + 8));
  QPDF::processFile(raw_bytes_1.field_2._M_local_buf + 8,"a.pdf");
  QUtil::read_file_into_string_abi_cxx11_
            ((char *)&root_1.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDF::getRoot();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"/Metadata",(allocator<char> *)((long)&n_pages_1 + 7));
  QPDFObjectHandle::getKey((string *)local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&n_pages_1 + 7));
  bVar1 = QPDFObjectHandle::isStream();
  if ((bVar1 & 1) == 0) {
    plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar3,"test 100 run on file with no metadata");
    __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  bVar2 = test_100::anon_class_1_0_00000001::operator()
                    (&local_1a,
                     (string *)
                     &root_1.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (QPDFObjectHandle *)local_88);
  if (!bVar2) {
    __assert_fail("is_cleartext_in_file(raw_bytes, root_metadata)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xdc0,"void test_100(QPDF &, const char *)");
  }
  bVar2 = test_100::anon_class_1_0_00000001::operator()(&local_19,(QPDFObjectHandle *)local_88,true)
  ;
  if (!bVar2) {
    __assert_fail("is_cleartext(root_metadata, true)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xdc1,"void test_100(QPDF &, const char *)");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"/Pages",&local_101);
  QPDFObjectHandle::getKey((string *)&local_e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_128,"/Count",
             (allocator<char> *)
             ((long)&page_1.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((string *)&local_d0);
  local_c0 = QPDFObjectHandle::getIntValue();
  sVar4 = QIntC::to_size<long_long>(&local_c0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_d0);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&page_1.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::~QPDFObjectHandle(&local_e0);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  local_b8 = sVar4;
  pvVar5 = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(pvVar5,local_b8 - 1)
  ;
  QPDFObjectHandle::QPDFObjectHandle
            ((QPDFObjectHandle *)
             &page_metadata_1.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pvVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_170,"/Metadata",
             (allocator<char> *)
             ((long)&copied_root_metadata.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((string *)local_150);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&copied_root_metadata.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  bVar1 = QPDFObjectHandle::isStream();
  if ((bVar1 & 1) == 0) {
    plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar3,"test 100 run on file with no metadata on last page");
    __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  bVar2 = test_100::anon_class_1_0_00000001::operator()
                    (&local_1a,
                     (string *)
                     &root_1.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (QPDFObjectHandle *)local_150);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!is_cleartext_in_file(raw_bytes, page_metadata)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xdc9,"void test_100(QPDF &, const char *)");
  }
  bVar2 = test_100::anon_class_1_0_00000001::operator()
                    (&local_19,(QPDFObjectHandle *)local_150,true);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!is_cleartext(page_metadata, true)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xdca,"void test_100(QPDF &, const char *)");
  }
  bVar2 = test_100::anon_class_1_0_00000001::operator()
                    (&local_19,(QPDFObjectHandle *)local_150,false);
  if (!bVar2) {
    __assert_fail("is_cleartext(page_metadata, false)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xdcb,"void test_100(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFObjectHandle
            ((QPDFObjectHandle *)
             &copied_page_metadata.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (QPDFObjectHandle *)local_88);
  QPDF::copyForeignObject((QPDFObjectHandle *)local_188);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &copied_page_metadata.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::QPDFObjectHandle(&local_1b8,(QPDFObjectHandle *)local_150);
  QPDF::copyForeignObject((QPDFObjectHandle *)local_1a8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_1b8);
  QPDF::getRoot();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"/CopiedRootMetadata",&local_1e9);
  QPDFObjectHandle::replaceKey((string *)&local_1c8,(QPDFObjectHandle *)local_1e8);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  QPDFObjectHandle::~QPDFObjectHandle(&local_1c8);
  QPDF::getRoot();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_220,"/CopiedPageMetadata",&local_221);
  QPDFObjectHandle::replaceKey((string *)&local_200,(QPDFObjectHandle *)local_220);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  QPDFObjectHandle::~QPDFObjectHandle(&local_200);
  QPDFWriter::QPDFWriter((QPDFWriter *)(raw_bytes.field_2._M_local_buf + 8),pdf,"b.pdf");
  QPDFWriter::setR6EncryptionParameters
            (raw_bytes.field_2._M_local_buf + 8,"",true,true,true,true,true,true,qpdf_r3p_low,false)
  ;
  QPDFWriter::write();
  QPDFWriter::~QPDFWriter((QPDFWriter *)(raw_bytes.field_2._M_local_buf + 8));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1a8);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_188);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_150);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &page_metadata_1.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_88);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &root_metadata_1.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string
            ((string *)
             &root_1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  QPDF::~QPDF((QPDF *)(raw_bytes_1.field_2._M_local_buf + 8));
  QUtil::read_file_into_string_abi_cxx11_((char *)&updated);
  QPDF::QPDF((QPDF *)&root.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDF::processFile((char *)&root.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                    "b.pdf");
  QPDF::getRoot();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a0,"/Metadata",(allocator<char> *)((long)&n_pages + 7));
  QPDFObjectHandle::getKey((string *)local_280);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&n_pages + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f8,"/Pages",&local_2f9);
  QPDFObjectHandle::getKey((string *)&local_2d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_320,"/Count",
             (allocator<char> *)
             ((long)&page.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((string *)&local_2c8);
  local_2b8 = QPDFObjectHandle::getIntValue();
  sVar4 = QIntC::to_size<long_long>(&local_2b8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_2c8);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&page.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::~QPDFObjectHandle(&local_2d8);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  local_2b0 = sVar4;
  pvVar5 = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                     (pvVar5,local_2b0 - 1);
  QPDFObjectHandle::QPDFObjectHandle
            ((QPDFObjectHandle *)
             &page_metadata.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pvVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_368,"/Metadata",
             (allocator<char> *)
             ((long)&copied_root.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((string *)local_348);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&copied_root.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3a0,"/CopiedRootMetadata",
             (allocator<char> *)
             ((long)&copied_page.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((string *)local_380);
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&copied_page.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3d8,"/CopiedPageMetadata",(allocator<char> *)((long)&__range1 + 7));
  QPDFObjectHandle::getKey((string *)local_3b8);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  bVar2 = test_100::anon_class_1_0_00000001::operator()
                    (&local_1a,(string *)&updated,(QPDFObjectHandle *)local_280);
  if (!bVar2) {
    __assert_fail("is_cleartext_in_file(raw_bytes, root_metadata)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xde2,"void test_100(QPDF &, const char *)");
  }
  bVar2 = test_100::anon_class_1_0_00000001::operator()
                    (&local_19,(QPDFObjectHandle *)local_280,true);
  if (!bVar2) {
    __assert_fail("is_cleartext(root_metadata, true)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xde3,"void test_100(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&__begin1,(QPDFObjectHandle *)local_348);
  QPDFObjectHandle::QPDFObjectHandle(&QStack_418,(QPDFObjectHandle *)local_380);
  QPDFObjectHandle::QPDFObjectHandle(&QStack_408,(QPDFObjectHandle *)local_3b8);
  local_3f8._M_array = (iterator)&__begin1;
  local_3f8._M_len = 3;
  local_3e8 = &local_3f8;
  __end1 = std::initializer_list<QPDFObjectHandle>::begin(local_3e8);
  o.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          std::initializer_list<QPDFObjectHandle>::end(local_3e8);
  while( true ) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__end1 ==
        o.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi) {
      local_558 = &local_3f8;
      do {
        local_558 = local_558 + -1;
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_558);
      } while (local_558 != (initializer_list<QPDFObjectHandle> *)&__begin1);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_3b8);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_380);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_348);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &page_metadata.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_280);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &root_metadata.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDF::~QPDF((QPDF *)&root.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&updated);
      return;
    }
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_448,__end1);
    bVar2 = test_100::anon_class_1_0_00000001::operator()
                      (&local_1a,(string *)&updated,(QPDFObjectHandle *)local_448);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!is_cleartext_in_file(raw_bytes, o)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xde6,"void test_100(QPDF &, const char *)");
    }
    bVar2 = test_100::anon_class_1_0_00000001::operator()
                      (&local_19,(QPDFObjectHandle *)local_448,true);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!is_cleartext(o, true)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xde7,"void test_100(QPDF &, const char *)");
    }
    bVar2 = test_100::anon_class_1_0_00000001::operator()
                      (&local_19,(QPDFObjectHandle *)local_448,false);
    if (!bVar2) break;
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_448);
    __end1 = __end1 + 1;
  }
  __assert_fail("is_cleartext(o, false)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0xde8,"void test_100(QPDF &, const char *)");
}

Assistant:

static void
test_100(QPDF& pdf, char const* arg2)
{
    // Designed for compressed-metadata.pdf
    auto is_cleartext = [](QPDFObjectHandle& metadata, bool raw) {
        std::string buf;
        Pl_String bufpl("buffer", nullptr, buf);
        metadata.pipeStreamData(&bufpl, 0, raw ? qpdf_dl_none : qpdf_dl_generalized);
        return buf.substr(0, 9) == "<?xpacket";
    };
    auto is_cleartext_in_file = [](std::string const& raw_bytes,
                                   QPDFObjectHandle& metadata) -> bool {
        auto buf = metadata.getRawStreamData();
        auto offset = metadata.getParsedOffset();
        auto from_file = raw_bytes.substr(QIntC::to_size(offset), 10);
        assert(buf->getSize() > 10);
        auto from_buf = std::string(reinterpret_cast<char*>(buf->getBuffer()), from_file.size());
        return from_buf == from_file;
    };

    {
        QPDFWriter w(pdf, "a.pdf");
        w.setR6EncryptionParameters(
            "", "", true, true, true, true, true, true, qpdf_r3p_full, false);
        w.write();
    }
    {
        QPDF encrypted;
        encrypted.processFile("a.pdf");
        auto raw_bytes = QUtil::read_file_into_string("a.pdf");
        auto root = encrypted.getRoot();
        auto root_metadata = root.getKey("/Metadata");
        if (!root_metadata.isStream()) {
            throw std::logic_error("test 100 run on file with no metadata");
        }
        assert(is_cleartext_in_file(raw_bytes, root_metadata));
        assert(is_cleartext(root_metadata, true));
        auto n_pages = QIntC::to_size(root.getKey("/Pages").getKey("/Count").getIntValue());
        auto page = encrypted.getAllPages().at(n_pages - 1);
        auto page_metadata = page.getKey("/Metadata");
        if (!page_metadata.isStream()) {
            throw std::logic_error("test 100 run on file with no metadata on last page");
        }
        // It's encrypted in the file, but you can recover the data, so it is properly decrypted.
        assert(!is_cleartext_in_file(raw_bytes, page_metadata));
        assert(!is_cleartext(page_metadata, true));
        assert(is_cleartext(page_metadata, false));

        // Now copy these metadata objects to the file and write it out again.
        auto copied_root_metadata = pdf.copyForeignObject(root_metadata);
        auto copied_page_metadata = pdf.copyForeignObject(page_metadata);
        pdf.getRoot().replaceKey("/CopiedRootMetadata", copied_root_metadata);
        pdf.getRoot().replaceKey("/CopiedPageMetadata", copied_root_metadata);
        QPDFWriter w(pdf, "b.pdf");
        w.setR6EncryptionParameters(
            "", "", true, true, true, true, true, true, qpdf_r3p_full, false);
        w.write();
    }
    auto raw_bytes = QUtil::read_file_into_string("b.pdf");
    QPDF updated;
    updated.processFile("b.pdf");
    auto root = updated.getRoot();
    auto root_metadata = root.getKey("/Metadata");
    auto n_pages = QIntC::to_size(root.getKey("/Pages").getKey("/Count").getIntValue());
    auto page = updated.getAllPages().at(n_pages - 1);
    auto page_metadata = page.getKey("/Metadata");
    auto copied_root = root.getKey("/CopiedRootMetadata");
    auto copied_page = root.getKey("/CopiedPageMetadata");
    // The ultimate root is still clear-text in file
    assert(is_cleartext_in_file(raw_bytes, root_metadata));
    assert(is_cleartext(root_metadata, true));
    // Everything else is compressed and encrypted in the file (not handled as special case).
    for (auto o: {page_metadata, copied_root, copied_page}) {
        assert(!is_cleartext_in_file(raw_bytes, o));
        assert(!is_cleartext(o, true));
        assert(is_cleartext(o, false));
    }
}